

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool nlohmann::detail::operator<(value_t lhs,value_t rhs)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  bool local_21;
  size_t r_index;
  size_t l_index;
  value_t rhs_local;
  value_t lhs_local;
  
  sVar2 = std::array<unsigned_char,_8UL>::size(&operator<::order);
  local_21 = false;
  if (lhs < sVar2) {
    sVar2 = std::array<unsigned_char,_8UL>::size(&operator<::order);
    local_21 = false;
    if (rhs < sVar2) {
      pbVar3 = std::array<unsigned_char,_8UL>::operator[](&operator<::order,(ulong)lhs);
      bVar1 = *pbVar3;
      pbVar3 = std::array<unsigned_char,_8UL>::operator[](&operator<::order,(ulong)rhs);
      local_21 = bVar1 < *pbVar3;
    }
  }
  return local_21;
}

Assistant:

inline bool operator<(const value_t lhs, const value_t rhs) noexcept {
	static constexpr std::array<std::uint8_t, 8> order = {{
		0 /* null */, 3 /* object */, 4 /* array */, 5 /* string */, 1 /* boolean */, 2 /* integer */, 2 /* unsigned */,
		2 /* float */
	}};

	const auto l_index = static_cast<std::size_t>(lhs);
	const auto r_index = static_cast<std::size_t>(rhs);
	return l_index < order.size() and r_index < order.size() and order[l_index] < order[r_index];
}